

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_FinishOddDivBy2(uint32 value,ScriptContext *scriptContext)

{
  Var pvVar1;
  ScriptContext *scriptContext_local;
  uint32 value_local;
  
  pvVar1 = JavascriptNumber::New((double)value + 0.5,scriptContext);
  return pvVar1;
}

Assistant:

Var JavascriptOperators::OP_FinishOddDivBy2(uint32 value, ScriptContext *scriptContext)
    {
        return JavascriptNumber::New((double)(value + 0.5), scriptContext);
    }